

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.h
# Opt level: O0

void __thiscall
Js::Utf8SourceInfo::
UndeferGlobalFunctions<Js::ParseableFunctionInfo::Parse(Js::ScriptFunction**,bool)::__0>
          (Utf8SourceInfo *this,anon_class_8_1_8991fb9c fn)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  undefined4 *puVar3;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar4;
  nullptr_t local_28;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *local_20;
  DeferredFunctionsDictionary *tmp;
  Utf8SourceInfo *this_local;
  anon_class_8_1_8991fb9c fn_local;
  
  tmp = (DeferredFunctionsDictionary *)this;
  this_local = (Utf8SourceInfo *)fn.this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->m_scriptContext);
  bVar2 = ScriptContext::DoUndeferGlobalFunctions(this_00);
  if (bVar2) {
    if ((this->field_0xa8 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                  ,0x14e,"(m_deferredFunctionsInitialized)",
                                  "m_deferredFunctionsInitialized");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizedDictionary__
                        ((WriteBarrierPtr *)&this->m_deferredFunctionsDictionary);
    if (*ppSVar4 !=
        (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)0x0) {
      ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizedDictionary__
                          ((WriteBarrierPtr *)&this->m_deferredFunctionsDictionary);
      local_20 = *ppSVar4;
      local_28 = (nullptr_t)0x0;
      Memory::
      WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
      ::operator=(&this->m_deferredFunctionsDictionary,&local_28);
      JsUtil::
      SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
      ::MapAndRemoveIf<Js::ParseableFunctionInfo::Parse(Js::ScriptFunction**,bool)::__0>
                ((SynchronizedDictionary<unsigned_int,Js::ParseableFunctionInfo*,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,Js::DefaultContainerLockPolicy,CriticalSection>
                  *)local_20,(anon_class_8_1_8991fb9c)this_local);
    }
  }
  return;
}

Assistant:

void UndeferGlobalFunctions(Fn fn)
        {
            if (this->m_scriptContext->DoUndeferGlobalFunctions())
            {
                Assert(m_deferredFunctionsInitialized);
                if (m_deferredFunctionsDictionary == nullptr)
                {
                    return;
                }

                DeferredFunctionsDictionary *tmp = this->m_deferredFunctionsDictionary;
                this->m_deferredFunctionsDictionary = nullptr;

                tmp->MapAndRemoveIf(fn);
            }
        }